

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

ecs_entity_t
ecs_run_intern(ecs_world_t *world,ecs_stage_t *stage,ecs_entity_t system,EcsSystem *system_data,
              float delta_time,int32_t offset,int32_t limit,ecs_filter_t *filter,void *param,
              _Bool ran_by_app)

{
  int32_t current_00;
  ecs_iter_action_t p_Var1;
  ecs_world_t *peVar2;
  _Bool _Var3;
  int32_t total_00;
  bool bVar4;
  double dVar5;
  int32_t current;
  int32_t total;
  ecs_thread_t *thread;
  ecs_iter_action_t action;
  ecs_iter_t it;
  _Bool defer;
  _Bool measure_time;
  ecs_time_t time_start;
  EcsTickSource *tick;
  ecs_entity_t tick_source;
  float time_elapsed;
  _Bool ran_by_app_local;
  int32_t limit_local;
  int32_t offset_local;
  float delta_time_local;
  EcsSystem *system_data_local;
  ecs_entity_t system_local;
  ecs_stage_t *stage_local;
  ecs_world_t *world_local;
  
  if (param == (void *)0x0) {
    param = system_data->ctx;
  }
  tick_source._4_4_ = delta_time;
  if (system_data->tick_source != 0) {
    time_start = (ecs_time_t)ecs_get_w_entity(world,system_data->tick_source,7);
    if (time_start == (ecs_time_t)0x0) {
      return 0;
    }
    tick_source._4_4_ = *(float *)((long)time_start + 4);
    if ((*(byte *)time_start & 1) == 0) {
      return 0;
    }
  }
  it.iter._87_1_ = world->measure_system_time & 1;
  if (it.iter._87_1_ != 0) {
    (*ecs_os_api.get_time_)((ecs_time_t *)&stack0xffffffffffffffa0);
  }
  stage->system = system;
  stage->system_columns = (system_data->query->sig).columns;
  it.iter._86_1_ = 0;
  bVar4 = stage->defer == 0;
  if (bVar4) {
    ecs_defer_begin(stage->world);
  }
  it.iter._86_1_ = bVar4;
  ecs_query_iter_page((ecs_iter_t *)&action,system_data->query,offset,limit);
  action = (ecs_iter_action_t)stage->world;
  it.param._4_4_ = tick_source._4_4_;
  it.delta_time = (world->stats).world_time_total;
  if (param == (void *)0x0) {
    it.entities = (ecs_entity_t *)system_data->ctx;
  }
  else {
    it.entities = (ecs_entity_t *)param;
  }
  p_Var1 = system_data->action;
  it.real_world = (ecs_world_t *)system;
  it.param._0_4_ = delta_time;
  it.delta_system_time = (float)offset;
  if ((ran_by_app) || (world == stage->world)) {
    while (_Var3 = ecs_query_next_w_filter((ecs_iter_t *)&action,filter), _Var3) {
      (*p_Var1)((ecs_iter_t *)&action);
    }
  }
  else {
    peVar2 = stage->world;
    total_00 = ecs_vector_count(world->workers);
    current_00 = *(int32_t *)&peVar2->c_info[0].on_add;
    while (_Var3 = ecs_query_next_worker((ecs_iter_t *)&action,current_00,total_00), _Var3) {
      (*p_Var1)((ecs_iter_t *)&action);
    }
  }
  if ((it.iter._86_1_ & 1) != 0) {
    ecs_defer_end(stage->world);
  }
  if ((it.iter._87_1_ & 1) != 0) {
    dVar5 = ecs_time_measure((ecs_time_t *)&stack0xffffffffffffffa0);
    system_data->time_spent = (float)dVar5 + system_data->time_spent;
  }
  stage->system = 0;
  stage->system_columns = (ecs_vector_t *)0x0;
  system_data->invoke_count = system_data->invoke_count + 1;
  return (ecs_entity_t)it.triggered_by;
}

Assistant:

ecs_entity_t ecs_run_intern(
    ecs_world_t *world,
    ecs_stage_t *stage,
    ecs_entity_t system,
    EcsSystem *system_data,
    FLECS_FLOAT delta_time,
    int32_t offset,
    int32_t limit,
    const ecs_filter_t *filter,
    void *param,
    bool ran_by_app) 
{
    if (!param) {
        param = system_data->ctx;
    }

    FLECS_FLOAT time_elapsed = delta_time;
    ecs_entity_t tick_source = system_data->tick_source;

    if (tick_source) {
        const EcsTickSource *tick = ecs_get(
            world, tick_source, EcsTickSource);

        if (tick) {
            time_elapsed = tick->time_elapsed;

            /* If timer hasn't fired we shouldn't run the system */
            if (!tick->tick) {
                return 0;
            }
        } else {
            /* If a timer has been set but the timer entity does not have the
             * EcsTimer component, don't run the system. This can be the result
             * of a single-shot timer that has fired already. Not resetting the
             * timer field of the system will ensure that the system won't be
             * ran after the timer has fired. */
            return 0;
        }
    }

    ecs_time_t time_start;
    bool measure_time = world->measure_system_time;
    if (measure_time) {
        ecs_os_get_time(&time_start);
    }

#ifndef NDEBUG
    stage->system = system;
    stage->system_columns = system_data->query->sig.columns;
#endif
    
    bool defer = false;
    if (!stage->defer) {
        ecs_defer_begin(stage->world);
        defer = true;
    }

    /* Prepare the query iterator */
    ecs_iter_t it = ecs_query_iter_page(system_data->query, offset, limit);
    it.world = stage->world;
    it.system = system;
    it.delta_time = delta_time;
    it.delta_system_time = time_elapsed;
    it.world_time = world->stats.world_time_total;
    it.frame_offset = offset;
    
    /* Set param if provided, otherwise use system context */
    if (param) {
        it.param = param;
    } else {
        it.param = system_data->ctx;
    }

    ecs_iter_action_t action = system_data->action;

    /* If no filter is provided, just iterate tables & invoke action */
    if (ran_by_app || world == stage->world) {
        while (ecs_query_next_w_filter(&it, filter)) {
            action(&it);
        }
    } else {
        ecs_thread_t *thread = (ecs_thread_t*)stage->world;
        int32_t total = ecs_vector_count(world->workers);
        int32_t current = thread->index;

        while (ecs_query_next_worker(&it, current, total)) {
            action(&it);               
        }
    }

    if (defer) {
        ecs_defer_end(stage->world);
    }

    if (measure_time) {
        system_data->time_spent += (FLECS_FLOAT)ecs_time_measure(&time_start);
    }

#ifndef NDEBUG
    stage->system = 0;
    stage->system_columns = NULL;
#endif

    system_data->invoke_count ++;

    return it.interrupted_by;
}